

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarestimator.cxx
# Opt level: O1

void __thiscall ScalarEstimator::setProperty(ScalarEstimator *this,Property *p,double d)

{
  int iVar1;
  double *pdVar2;
  ulong uVar3;
  
  iVar1 = *p;
  if (iVar1 == 3) {
    if (0.0 < d) {
      this->nDist = (int)d;
    }
  }
  else if (iVar1 == 2) {
    this->aDistRange[1] = d;
  }
  else {
    if (iVar1 != 1) {
      return;
    }
    this->aDistRange[0] = d;
  }
  if (this->aDist != (double *)0x0) {
    operator_delete__(this->aDist);
  }
  iVar1 = this->nDist;
  uVar3 = 0xffffffffffffffff;
  if (-1 < (long)iVar1) {
    uVar3 = (long)iVar1 * 8;
  }
  pdVar2 = (double *)operator_new__(uVar3);
  this->aDist = pdVar2;
  this->dDistOffset = this->aDistRange[0];
  this->dDistScale = (this->aDistRange[1] - this->aDistRange[0]) / (double)iVar1;
  return;
}

Assistant:

void ScalarEstimator::setProperty(const Property& p, double d)
{
	if( p == EST_DIST_MIN ) {
		aDistRange[0] = d;
		delete[] aDist;
		aDist = new double[nDist];
		dDistOffset = double(aDistRange[0]);
		dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	} else if ( p == EST_DIST_MAX ) {
		aDistRange[1] = d;
		delete[] aDist;
		aDist = new double[nDist];
		dDistOffset = double(aDistRange[0]);
		dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	} else if ( p == EST_DIST_BINS ) {
		if( d>0 )
			nDist = (int) d;
		delete[] aDist;
		aDist = new double[nDist];
		dDistOffset = double(aDistRange[0]);
		dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	}
}